

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooking.cpp
# Opt level: O0

void __thiscall ChickenHook::Hooking::installHandler(Hooking *this)

{
  undefined1 local_a8 [8];
  sigaction sa;
  Hooking *this_local;
  
  sa.sa_restorer = (_func_void *)this;
  memset(local_a8,0,0x98);
  sigemptyset((sigset_t *)&sa);
  local_a8 = (undefined1  [8])trampoline_receiver;
  sa.sa_mask.__val[0xf]._0_4_ = 4;
  sigaction(4,(sigaction *)local_a8,(sigaction *)0x0);
  sigaction(0xb,(sigaction *)local_a8,(sigaction *)0x0);
  return;
}

Assistant:

void Hooking::installHandler() {
        struct sigaction sa;
        memset(&sa, 0, sizeof(struct sigaction));
        sigemptyset(&sa.sa_mask);
        sa.sa_sigaction = trampoline_receiver;
        sa.sa_flags = SA_SIGINFO;

        sigaction(SIGILL, &sa, nullptr);
        sigaction(SIGSEGV, &sa, nullptr);
    }